

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_isSolveStopped(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,bool *stoppedTime,bool *stoppedIter)

{
  bool bVar1;
  Settings *pSVar2;
  double extraout_XMM0_Qa;
  
  pSVar2 = this->_currentSettings;
  if (pSVar2->_realParamValues[6] < pSVar2->_realParamValues[7] ||
      pSVar2->_realParamValues[6] == pSVar2->_realParamValues[7]) {
    bVar1 = false;
  }
  else {
    (*this->_statistics->solvingTime->_vptr_Timer[6])();
    pSVar2 = this->_currentSettings;
    bVar1 = pSVar2->_realParamValues[7] <= extraout_XMM0_Qa;
  }
  *stoppedTime = bVar1;
  if (((pSVar2->_intParamValues[5] < 0) ||
      (bVar1 = true, this->_statistics->iterations < pSVar2->_intParamValues[5])) &&
     ((pSVar2->_intParamValues[6] < 0 ||
      (bVar1 = true, this->_statistics->refinements < pSVar2->_intParamValues[6])))) {
    if (pSVar2->_intParamValues[7] < 0) {
      bVar1 = false;
    }
    else {
      bVar1 = pSVar2->_intParamValues[7] <= this->_statistics->stallRefinements;
    }
  }
  *stoppedIter = bVar1;
  return (bool)(bVar1 | *stoppedTime & 1U);
}

Assistant:

bool SoPlexBase<R>::_isSolveStopped(bool& stoppedTime, bool& stoppedIter) const
{
   assert(_statistics != nullptr);

   stoppedTime = (realParam(TIMELIMIT) < realParam(INFTY)
                  && _statistics->solvingTime->time() >= realParam(TIMELIMIT));
   stoppedIter = (intParam(ITERLIMIT) >= 0 && _statistics->iterations >= intParam(ITERLIMIT))
                 || (intParam(REFLIMIT) >= 0 && _statistics->refinements >= intParam(REFLIMIT))
                 || (intParam(STALLREFLIMIT) >= 0 && _statistics->stallRefinements >= intParam(STALLREFLIMIT));

   return stoppedTime || stoppedIter;
}